

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O0

bool __thiscall pcap_reader::Open(pcap_reader *this,char *f_name,char *f_extract_name)

{
  uint32_t uVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  size_t nb_read;
  int err;
  bool ret;
  char *f_extract_name_local;
  char *f_name_local;
  pcap_reader *this_local;
  
  nb_read._7_1_ = 1;
  if ((this->F_pcap == (FILE *)0x0) && (this->F_extract == (FILE *)0x0)) {
    nb_read._0_4_ = 0;
    _err = f_extract_name;
    f_extract_name_local = f_name;
    f_name_local = &this->is_wrong_endian;
    iVar2 = strcmp(f_name,"-");
    if (iVar2 == 0) {
      pFVar3 = ithi_reopen_stdin((int *)&nb_read);
      this->F_pcap = pFVar3;
    }
    else {
      pFVar3 = ithi_file_open_ex(f_extract_name_local,"rb",(int *)&nb_read);
      this->F_pcap = pFVar3;
    }
    if (((uint)nb_read == 0) && (this->F_pcap != (FILE *)0x0)) {
      if (_err != (char *)0x0) {
        pFVar3 = ithi_file_open_ex(_err,"wb",(int *)&nb_read);
        this->F_extract = pFVar3;
        if (((uint)nb_read != 0) || (this->F_pcap == (FILE *)0x0)) {
          nb_read._7_1_ = 0;
          printf("Error: %d (0x%x) for %s\n",(ulong)(uint)nb_read,(ulong)(uint)nb_read,_err);
        }
      }
    }
    else {
      nb_read._7_1_ = 0;
      printf("Error: %d (0x%x) for %s\n",(ulong)(uint)nb_read,(ulong)(uint)nb_read,
             f_extract_name_local);
    }
    if ((nb_read._7_1_ & 1) != 0) {
      sVar4 = fread(&this->header,0x18,1,(FILE *)this->F_pcap);
      nb_read._7_1_ = sVar4 == 1;
      if ((((bool)nb_read._7_1_) && (uVar1 = (this->header).magic_number, uVar1 != 0xa1b23c4d)) &&
         (uVar1 != 0xa1b2c3d4)) {
        if (uVar1 == 0xd4c3b2a1) {
          this->is_wrong_endian = true;
        }
        else if (uVar1 == 0x4dc3b2a1) {
          this->is_wrong_endian = true;
        }
        else {
          nb_read._7_1_ = false;
        }
      }
      if (((bool)nb_read._7_1_ != false) && (this->F_extract != (FILE *)0x0)) {
        sVar4 = fwrite(&this->header,0x18,1,(FILE *)this->F_extract);
        nb_read._7_1_ = sVar4 == 1;
      }
    }
  }
  else {
    nb_read._7_1_ = 0;
  }
  return (bool)(nb_read._7_1_ & 1);
}

Assistant:

bool pcap_reader::Open(char const * f_name, char * f_extract_name)
{
    bool ret = true;

    if (F_pcap != NULL || F_extract != NULL)
    {
        ret = false;
    }
    else
    {
        int err = 0;

        if (strcmp(f_name, "-") == 0) {
            F_pcap = ithi_reopen_stdin(&err);
        }
        else {
            F_pcap = ithi_file_open_ex(f_name, "rb", &err);
        }

        if (err != 0 || F_pcap == NULL)
        {
            ret = false;
            printf("Error: %d (0x%x) for %s\n", err, err, f_name);
        } else if (f_extract_name != NULL) {
            F_extract = ithi_file_open_ex(f_extract_name, "wb", &err);
            if (err != 0 || F_pcap == NULL)
            {
                ret = false;
                printf("Error: %d (0x%x) for %s\n", err, err, f_extract_name);
            }
        }

        if (ret)
        {
            size_t nb_read = fread(&header, sizeof(header), 1, F_pcap);

            ret = (nb_read == 1);

            if (ret)
            {
                switch (header.magic_number)
                {
                case 0xa1b2c3d4: /* microseconds */
                    break;
                case 0xd4c3b2a1: /* microseconds, swapped */
                    is_wrong_endian = true;
                    break;
                case 0xa1b23c4d: /* nanoseconds */
                    break;
                case 0x4dc3b2a1: /* nanoseconds, swapped */
                    is_wrong_endian = true;
                    break;
                default:
                    ret = false;
                    break;
                }
            }

            if (ret && is_wrong_endian)
            {
                /* TODO: swap the values.. */
            }

            if (ret && F_extract != NULL)
            {
                ret = (fwrite(&header, sizeof(header), 1, F_extract) == 1);
            }
        }
    }

    return ret;
}